

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fiordhtml(errcxdef *ec,osfildef *fp,appctxdef *appctx,int resfileno,char *resfilename)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  unsigned_long uVar4;
  char *pcVar5;
  ulong __size;
  ulong uVar6;
  uchar buf [256];
  uint local_138 [2];
  ushort local_130;
  
  if (appctx != (appctxdef *)0x0) {
    sVar3 = fread(local_138,8,1,(FILE *)fp);
    if (sVar3 != 1) {
LAB_0012b367:
      sVar3 = strlen(resfilename);
      pcVar5 = errstr(ec,resfilename,(int)sVar3);
      ec->errcxptr->erraav[0].errastr = pcVar5;
      ec->errcxptr->erraac = 1;
      errsign(ec,0x26a,"TADS");
    }
    uVar6 = (ulong)local_138[0];
    if (uVar6 != 0) {
      do {
        sVar3 = fread(local_138,10,1,(FILE *)fp);
        uVar2 = local_138[1];
        uVar1 = local_138[0];
        if (sVar3 != 1) goto LAB_0012b367;
        __size = (ulong)local_130;
        sVar3 = fread(local_138,__size,1,(FILE *)fp);
        if (sVar3 != 1) goto LAB_0012b367;
        if (appctx->add_resource !=
            (_func_void_void_ptr_unsigned_long_unsigned_long_char_ptr_size_t_int *)0x0) {
          (*appctx->add_resource)
                    (appctx->add_resource_ctx,(unsigned_long)uVar1,(unsigned_long)uVar2,
                     (char *)local_138,__size,resfileno);
        }
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    if (appctx->set_resmap_seek != (_func_void_void_ptr_unsigned_long_int *)0x0) {
      uVar4 = ftell((FILE *)fp);
      (*appctx->set_resmap_seek)(appctx->set_resmap_seek_ctx,uVar4,resfileno);
    }
  }
  return;
}

Assistant:

static void fiordhtml(errcxdef *ec, osfildef *fp, appctxdef *appctx,
                      int resfileno, const char *resfilename)
{
    uchar buf[256];

    /* 
     *   resource map - if the host system is interested, tell it about it 
     */
    if (appctx != 0)
    {
        ulong entry_cnt;
        ulong i;
        
        /* read the index table header */
        if (osfrb(fp, buf, 8))
            errsig1(ec, ERR_RDRSC, ERRTSTR,
                    errstr(ec, resfilename, strlen(resfilename)));

        /* get the number of entries in the table */
        entry_cnt = osrp4(buf);
        
        /* read the index entries */
        for (i = 0 ; i < entry_cnt ; ++i)
        {
            ulong res_ofs;
            ulong res_siz;
            ushort res_namsiz;
            
            /* read this entry */
            if (osfrb(fp, buf, 10))
                errsig1(ec, ERR_RDRSC, ERRTSTR,
                        errstr(ec, resfilename, strlen(resfilename)));

            /* get the entry header */
            res_ofs = osrp4(buf);
            res_siz = osrp4(buf + 4);
            res_namsiz = osrp2(buf + 8);
            
            /* read this entry's name */
            if (osfrb(fp, buf, res_namsiz))
                errsig1(ec, ERR_RDRSC, ERRTSTR,
                        errstr(ec, resfilename, strlen(resfilename)));
            
            /* tell the host system about this entry */
            if (appctx->add_resource)
                (*appctx->add_resource)(appctx->add_resource_ctx,
                                        res_ofs, res_siz,
                                        (char *)buf,
                                        (size_t)res_namsiz,
                                        resfileno);
        }
        
        /* tell the host system where the resources start */
        if (appctx->set_resmap_seek != 0)
        {
            long pos = osfpos(fp);
            (*appctx->set_resmap_seek)(appctx->set_resmap_seek_ctx,
                                       pos, resfileno);
        }
    }
}